

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O1

void __thiscall
InlineeFrameInfo::AllocateRecord(InlineeFrameInfo *this,Func *inlinee,intptr_t functionBodyAddr)

{
  char cVar1;
  uint argCount;
  ArgList *pAVar2;
  Type pIVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  InlineeFrameRecord *pIVar7;
  undefined4 *puVar8;
  Var pvVar9;
  uint constantCount;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  argCount = (this->arguments->
             super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
             count;
  if ((long)(int)argCount < 1) {
    iVar6 = 0;
  }
  else {
    lVar11 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)(*(int *)((long)&((this->arguments->
                                              super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                                              ).buffer)->type + lVar11) == 2);
      lVar11 = lVar11 + 0x18;
    } while ((long)(int)argCount * 0x18 != lVar11);
  }
  constantCount = (uint)((this->function).type == InlineeFrameInfoValueType_Const) + iVar6;
  if (this->record == (InlineeFrameRecord *)0x0) {
    pIVar7 = InlineeFrameRecord::New
                       (&inlinee->topFunc->nativeCodeDataAllocator,argCount,constantCount,
                        functionBodyAddr,this);
    this->record = pIVar7;
  }
  pAVar2 = this->arguments;
  if ((pAVar2->super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>)
      .count < 1) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    lVar11 = 8;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar12 = 0;
    do {
      pIVar3 = (pAVar2->
               super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>)
               .buffer;
      if (*(int *)((long)pIVar3 + lVar11 + -8) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                           ,0x6c,"(value.type != InlineeFrameInfoValueType_None)",
                           "value.type != InlineeFrameInfoValueType_None");
        if (!bVar5) goto LAB_00561370;
        *puVar8 = 0;
      }
      if (*(int *)((long)pIVar3 + lVar11 + -8) == 1) {
        iVar6 = *(int *)(*(long *)((long)&pIVar3->type + lVar11) + 0x20) + -0x10;
        if (-1 < iVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                             ,0x76,"(offset < 0)","offset < 0");
          if (!bVar5) goto LAB_00561370;
          *puVar8 = 0;
        }
        pIVar7 = this->record;
        pIVar7->argOffsets[lVar12] = iVar6;
        cVar1 = *(char *)(*(long *)((long)&pIVar3->type + lVar11) + 0x1c);
        if (cVar1 == '\x03') {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)lVar12);
          (pIVar7->losslessInt32Args).word =
               (pIVar7->losslessInt32Args).word | 1L << ((byte)lVar12 & 0x3f);
        }
        else if (cVar1 == '\n') {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)lVar12);
          (pIVar7->floatArgs).word = (pIVar7->floatArgs).word | 1L << ((byte)lVar12 & 0x3f);
        }
      }
      else {
        if (constantCount <= uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                             ,0x84,"(constantIndex < constantCount)","constantIndex < constantCount"
                            );
          if (!bVar5) goto LAB_00561370;
          *puVar8 = 0;
        }
        pvVar9 = BailoutConstantValue::ToVar
                           ((BailoutConstantValue *)((long)&pIVar3->type + lVar11),inlinee);
        this->record->constants[uVar10] = pvVar9;
        this->record->argOffsets[lVar12] = uVar10;
        uVar10 = uVar10 + 1;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x18;
    } while (lVar12 < (pAVar2->
                      super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                      ).count);
  }
  if ((this->function).type == InlineeFrameInfoValueType_Sym) {
    uVar10 = ((this->function).field_1.sym)->m_offset - 0x10;
  }
  else {
    if ((inlinee->field_0x240 & 2) == 0) {
      return;
    }
    if (constantCount <= uVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x9a,"(constantIndex < constantCount)","constantIndex < constantCount");
      if (!bVar5) {
LAB_00561370:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    pvVar9 = BailoutConstantValue::ToVar(&(this->function).field_1.constValue,inlinee);
    this->record->constants[uVar10] = pvVar9;
  }
  this->record->functionOffset = uVar10;
  return;
}

Assistant:

void InlineeFrameInfo::AllocateRecord(Func* inlinee, intptr_t functionBodyAddr)
{
    uint constantCount = 0;

    // If there are no helper calls there is a chance that frame record is not required after all;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        if (value.IsConst())
        {
            constantCount++;
        }
    });

    if (function.IsConst())
    {
        constantCount++;
    }

    // For InlineeEnd's that have been cloned we can result in multiple calls
    // to allocate the record - do not allocate a new record - instead update the existing one.
    // In particular, if the first InlineeEnd resulted in no calls and spills, subsequent might still spill - so it's a good idea to
    // update the record
    if (!this->record)
    {
        this->record = InlineeFrameRecord::New(inlinee->GetNativeCodeDataAllocator(), (uint)arguments->Count(), constantCount, functionBodyAddr, this);
    }

    uint i = 0;
    uint constantIndex = 0;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        Assert(value.type != InlineeFrameInfoValueType_None);
        if (value.type == InlineeFrameInfoValueType_Sym)
        {
            int offset;
#ifdef MD_GROW_LOCALS_AREA_UP
            offset = -((int)value.sym->m_offset + BailOutInfo::StackSymBias);
#else
            // Stack offset are negative, includes the PUSH EBP and return address
            offset = value.sym->m_offset - (2 * MachPtr);
#endif
            Assert(offset < 0);
            this->record->argOffsets[i] = offset;
            if (value.sym->IsFloat64())
            {
                this->record->floatArgs.Set(i);
            }
            else if (value.sym->IsInt32())
            {
                this->record->losslessInt32Args.Set(i);
            }
        }
        else
        {
            // Constants
            Assert(constantIndex < constantCount);
            this->record->constants[constantIndex] = value.constValue.ToVar(inlinee);
            this->record->argOffsets[i] = constantIndex;
            constantIndex++;
        }
        i++;
    });

    if (function.type == InlineeFrameInfoValueType_Sym)
    {
        int offset;

#ifdef MD_GROW_LOCALS_AREA_UP
        offset = -((int)function.sym->m_offset + BailOutInfo::StackSymBias);
#else
        // Stack offset are negative, includes the PUSH EBP and return address
        offset = function.sym->m_offset - (2 * MachPtr);
#endif
        this->record->functionOffset = offset;
    }
    else if (inlinee->m_hasInlineArgsOpt)
    {
        Assert(constantIndex < constantCount);
        this->record->constants[constantIndex] = function.constValue.ToVar(inlinee);
        this->record->functionOffset = constantIndex;
    }
}